

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::OutputCountShader::shadePrimitives
          (OutputCountShader *this,GeometryEmitter *output,int verticesIn,PrimitivePacket *packets,
          int numPackets,int invocationID)

{
  int iVar1;
  int iVar2;
  int iVar3;
  GenericVec4 *varyings;
  Vec4 *a;
  VertexPacket *pVVar4;
  PrimitivePacket *pPVar5;
  int iVar6;
  float fVar7;
  Vector<float,_4> local_98;
  GeometryEmitter *local_88;
  PrimitivePacket *local_80;
  OutputCountShader *local_78;
  ulong local_70;
  ulong local_68;
  GenericVec4 *local_60;
  Vec4 *local_58;
  VertexPacket *local_50;
  PrimitivePacket *local_48;
  tcu local_40 [16];
  
  iVar1 = *(int *)&(this->super_ShaderProgram).field_0x154;
  iVar2 = this->m_patternMaxEmitCount;
  local_68 = 0;
  local_70 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    local_70 = local_68;
  }
  local_88 = output;
  local_80 = packets;
  local_78 = this;
  for (; local_68 != local_70; local_68 = local_68 + 1) {
    local_48 = local_80 + local_68;
    local_50 = local_80[local_68].vertices[0];
    iVar3 = (local_78->m_spec).pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_80[local_68].primitiveIDIn];
    local_58 = &local_50->position;
    local_60 = local_50->outputs;
    for (iVar6 = 0; a = local_58, iVar6 < iVar3 / 2; iVar6 = iVar6 + 1) {
      fVar7 = ((float)iVar6 + (float)iVar6) * (2.0 / (float)iVar2);
      local_98.m_data[1] = 0.0;
      local_98.m_data[2] = 0.0;
      local_98.m_data[3] = 0.0;
      local_98.m_data[0] = fVar7;
      tcu::operator+(local_40,local_58,&local_98);
      pPVar5 = local_48;
      pVVar4 = local_50;
      varyings = local_60;
      rr::GeometryEmitter::EmitVertex
                (output,(Vec4 *)local_40,local_50->pointSize,local_60,local_48->primitiveIDIn);
      local_98.m_data[2] = 0.0;
      local_98.m_data[3] = 0.0;
      local_98.m_data[0] = fVar7;
      local_98.m_data[1] = 2.0 / (float)iVar1;
      tcu::operator+(local_40,a,&local_98);
      rr::GeometryEmitter::EmitVertex
                (output,(Vec4 *)local_40,pVVar4->pointSize,varyings,pPVar5->primitiveIDIn);
    }
    rr::GeometryEmitter::EndPrimitive(local_88);
  }
  return;
}

Assistant:

void OutputCountShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);
	DE_UNREF(invocationID);

	const float rowHeight	= 2.0f / (float)m_patternLength;
	const float colWidth	= 2.0f / (float)m_patternMaxEmitCount;

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		// Create triangle strip at this point
		const rr::VertexPacket*	vertex		= packets[packetNdx].vertices[0];
		const int				emitCount	= m_spec.pattern[packets[packetNdx].primitiveIDIn];

		for (int ndx = 0; ndx < emitCount / 2; ++ndx)
		{
			output.EmitVertex(vertex->position + tcu::Vec4(2 * (float)ndx * colWidth, 0.0,       0.0, 0.0), vertex->pointSize, vertex->outputs, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(vertex->position + tcu::Vec4(2 * (float)ndx * colWidth, rowHeight, 0.0, 0.0), vertex->pointSize, vertex->outputs, packets[packetNdx].primitiveIDIn);
		}
		output.EndPrimitive();
	}
}